

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O3

bool __thiscall duckdb::LineReader::NextLine(LineReader *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  ulong local_40;
  
  local_40 = 0;
LAB_00212e8a:
  do {
    uVar4 = this->position;
    uVar5 = this->capacity;
    uVar3 = uVar4;
    uVar2 = uVar4;
    if (uVar4 < uVar5) {
      do {
        uVar3 = uVar2;
        if ((this->data_buffer[uVar2] == '\n') || (this->data_buffer[uVar2] == '\r')) break;
        uVar2 = uVar2 + 1;
        uVar3 = uVar5;
      } while (uVar5 != uVar2);
    }
    if (uVar3 < uVar5) {
      uVar5 = uVar3;
    }
    uVar3 = (uVar5 - uVar4) + local_40;
    bVar6 = uVar3 < 0x32001;
    if (!bVar6) {
      uVar4 = this->capacity;
      if (uVar4 == 0) {
        return bVar6;
      }
      bVar6 = false;
      do {
        uVar5 = this->position;
        uVar3 = uVar5;
        if (uVar5 < uVar4) {
          do {
            uVar3 = uVar5;
            if ((this->data_buffer[uVar5] == '\n') || (this->data_buffer[uVar5] == '\r')) break;
            uVar5 = uVar5 + 1;
            uVar3 = uVar4;
          } while (uVar4 != uVar5);
        }
        if (uVar3 < uVar4) {
          bVar6 = true;
        }
        if (bVar6) goto LAB_00212f48;
        FillBuffer(this);
        uVar4 = this->capacity;
        if (uVar4 == 0) {
          return false;
        }
      } while( true );
    }
    switchD_00b03519::default(this->line_buffer + local_40,this->data_buffer + uVar4,uVar5 - uVar4);
    if (uVar5 < this->capacity) {
      *(undefined1 *)((long)this + uVar3 + 0x10) = 0;
      this->position = uVar5 + 1;
      if (this->data_buffer[uVar5] == '\r') {
        SkipNewline(this);
      }
      local_40 = 0;
      if (uVar3 != 0) {
        bVar1 = Utf8Proc::IsValid(this->line_buffer,uVar3);
        local_40 = 0;
        if (bVar1) {
          return bVar6;
        }
      }
    }
    else {
      FillBuffer(this);
      local_40 = uVar3;
      if (this->capacity == 0) {
        return uVar3 != 0;
      }
    }
  } while( true );
LAB_00212f48:
  if (uVar3 < uVar4) {
    uVar4 = uVar3;
  }
  this->position = uVar4 + 1;
  if (this->data_buffer[uVar4] == '\r') {
    SkipNewline(this);
  }
  goto LAB_00212e8a;
}

Assistant:

bool NextLine() {
		idx_t line_size = 0;
		while (true) {
			// find the next newline in the current buffer (if any)
			idx_t i = GetNextNewline();
			// copy over the data and move to the next byte
			idx_t read_count = i - position;
			if (line_size + read_count > LINENOISE_MAX_LINE) {
				// exceeded max line size
				// move on to next line and don't add to history
				// skip to next newline
				bool found_next_newline = false;
				while (!found_next_newline && capacity > 0) {
					i = GetNextNewline();
					if (i < capacity) {
						found_next_newline = true;
					}
					if (!found_next_newline) {
						// read more data
						FillBuffer();
					}
				}
				if (!found_next_newline) {
					// no newline found - skip
					return false;
				}
				// newline found - adjust position and read next line
				position = i + 1;
				if (data_buffer[i] == '\r') {
					// \r\n - skip the next byte as well
					SkipNewline();
				}
				continue;
			}
			memcpy(line_buffer + line_size, data_buffer + position, read_count);
			line_size += read_count;

			if (i < capacity) {
				// we're still within the buffer - this means we found a newline in the buffer
				line_buffer[line_size] = '\0';
				position = i + 1;
				if (data_buffer[i] == '\r') {
					// \r\n - skip the next byte as well
					SkipNewline();
				}
				if (line_size == 0 || !Utf8Proc::IsValid(line_buffer, line_size)) {
					// line is empty OR not valid UTF8
					// move on to next line and don't add to history
					line_size = 0;
					continue;
				}
				return true;
			}
			// we need to read more data - fill up the buffer
			FillBuffer();
			if (capacity == 0) {
				// no more data available - return true if there is anything we copied over (i.e. part of the next line)
				return line_size > 0;
			}
		}
	}